

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O2

ikcpcb * ikcp_create(IUINT32 conv,void *user)

{
  ikcpcb *ptr;
  char *pcVar1;
  
  ptr = (ikcpcb *)ikcp_malloc(0x110);
  if (ptr != (ikcpcb *)0x0) {
    ptr->conv = conv;
    ptr->user = user;
    ptr->ts_probe = 0;
    ptr->probe_wait = 0;
    ptr->snd_una = 0;
    ptr->snd_nxt = 0;
    ptr->rcv_nxt = 0;
    ptr->ts_recent = 0;
    ptr->ts_lastack = 0;
    ptr->snd_wnd = 0x20;
    ptr->rcv_wnd = 0x80;
    ptr->rmt_wnd = 0x80;
    ptr->cwnd = 0;
    ptr->incr = 0;
    ptr->probe = 0;
    ptr->mtu = 0x578;
    ptr->mss = 0x560;
    ptr->stream = 0;
    pcVar1 = (char *)ikcp_malloc(0x10b0);
    ptr->buffer = pcVar1;
    if (pcVar1 != (char *)0x0) {
      (ptr->snd_queue).next = &ptr->snd_queue;
      (ptr->snd_queue).prev = &ptr->snd_queue;
      (ptr->rcv_queue).next = &ptr->rcv_queue;
      (ptr->rcv_queue).prev = &ptr->rcv_queue;
      (ptr->snd_buf).next = &ptr->snd_buf;
      (ptr->snd_buf).prev = &ptr->snd_buf;
      (ptr->rcv_buf).next = &ptr->rcv_buf;
      (ptr->rcv_buf).prev = &ptr->rcv_buf;
      ptr->state = 0;
      ptr->nrcv_buf = 0;
      ptr->nsnd_buf = 0;
      ptr->nrcv_que = 0;
      ptr->nsnd_que = 0;
      ptr->acklist = (IUINT32 *)0x0;
      ptr->ackcount = 0;
      ptr->ackblock = 0;
      ptr->rx_minrto = 100;
      ptr->nodelay = 0;
      ptr->updated = 0;
      ptr->logmask = 0;
      ptr->ssthresh = 2;
      ptr->rx_rttval = 0;
      ptr->rx_srtt = 0;
      ptr->rx_rto = 200;
      ptr->fastresend = 0;
      ptr->fastlimit = 5;
      ptr->nocwnd = 0;
      ptr->current = 0;
      ptr->interval = 100;
      ptr->ts_flush = 100;
      ptr->xmit = 0;
      ptr->dead_link = 0x14;
      ptr->output = (_func_int_char_ptr_int_IKCPCB_ptr_void_ptr *)0x0;
      ptr->writelog = (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0;
      return ptr;
    }
    ikcp_free(ptr);
  }
  return (ikcpcb *)0x0;
}

Assistant:

ikcpcb* ikcp_create(IUINT32 conv, void *user)
{
	ikcpcb *kcp = (ikcpcb*)ikcp_malloc(sizeof(struct IKCPCB));
	if (kcp == NULL) return NULL;
	kcp->conv = conv;
	kcp->user = user;
	kcp->snd_una = 0;
	kcp->snd_nxt = 0;
	kcp->rcv_nxt = 0;
	kcp->ts_recent = 0;
	kcp->ts_lastack = 0;
	kcp->ts_probe = 0;
	kcp->probe_wait = 0;
	kcp->snd_wnd = IKCP_WND_SND;
	kcp->rcv_wnd = IKCP_WND_RCV;
	kcp->rmt_wnd = IKCP_WND_RCV;
	kcp->cwnd = 0;
	kcp->incr = 0;
	kcp->probe = 0;
	kcp->mtu = IKCP_MTU_DEF;
	kcp->mss = kcp->mtu - IKCP_OVERHEAD;
	kcp->stream = 0;

	kcp->buffer = (char*)ikcp_malloc((kcp->mtu + IKCP_OVERHEAD) * 3);
	if (kcp->buffer == NULL) {
		ikcp_free(kcp);
		return NULL;
	}

	iqueue_init(&kcp->snd_queue);
	iqueue_init(&kcp->rcv_queue);
	iqueue_init(&kcp->snd_buf);
	iqueue_init(&kcp->rcv_buf);
	kcp->nrcv_buf = 0;
	kcp->nsnd_buf = 0;
	kcp->nrcv_que = 0;
	kcp->nsnd_que = 0;
	kcp->state = 0;
	kcp->acklist = NULL;
	kcp->ackblock = 0;
	kcp->ackcount = 0;
	kcp->rx_srtt = 0;
	kcp->rx_rttval = 0;
	kcp->rx_rto = IKCP_RTO_DEF;
	kcp->rx_minrto = IKCP_RTO_MIN;
	kcp->current = 0;
	kcp->interval = IKCP_INTERVAL;
	kcp->ts_flush = IKCP_INTERVAL;
	kcp->nodelay = 0;
	kcp->updated = 0;
	kcp->logmask = 0;
	kcp->ssthresh = IKCP_THRESH_INIT;
	kcp->fastresend = 0;
	kcp->fastlimit = IKCP_FASTACK_LIMIT;
	kcp->nocwnd = 0;
	kcp->xmit = 0;
	kcp->dead_link = IKCP_DEADLINK;
	kcp->output = NULL;
	kcp->writelog = NULL;

	return kcp;
}